

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Compressor::Impl::writePaletted
          (Impl *this,Image *image,
          unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
          *palette,bool separateAlpha)

{
  bool bVar1;
  unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
  *this_00;
  mapped_type *pmVar2;
  reference pCVar3;
  byte in_CL;
  undefined8 in_RDX;
  Size *in_RSI;
  long in_RDI;
  Color c_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Color,_std::allocator<Color>_> *__range2;
  Color c;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Color,_std::allocator<Color>_> *__range1_1;
  uint8_t *ptr;
  value_type *pair;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
  *__range1;
  Color *palData;
  key_type *in_stack_ffffffffffffff58;
  uchar uStack_89;
  size_type in_stack_ffffffffffffff78;
  __normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_>
  in_stack_ffffffffffffff80;
  __normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_> local_60;
  Size *local_58;
  uchar *local_50;
  reference local_48;
  _Node_iterator_base<std::pair<const_Color,_unsigned_char>,_true> local_40;
  _Node_iterator_base<std::pair<const_Color,_unsigned_char>,_true> local_38;
  undefined8 local_30;
  uchar *local_28;
  byte local_19;
  undefined8 local_18;
  Size *local_10;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10cc33);
  this_00 = (unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
             *)(in_RDI + 0x88);
  Size::area(local_10);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_ffffffffffffff80._M_current,in_stack_ffffffffffffff78);
  local_28 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10cc8f);
  local_30 = local_18;
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
       ::begin((unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
                *)in_stack_ffffffffffffff58);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
       ::end((unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
              *)in_stack_ffffffffffffff58);
  while (bVar1 = std::__detail::operator!=(&local_38,&local_40), bVar1) {
    local_48 = std::__detail::
               _Node_const_iterator<std::pair<const_Color,_unsigned_char>,_false,_true>::operator*
                         ((_Node_const_iterator<std::pair<const_Color,_unsigned_char>,_false,_true>
                           *)0x10cce1);
    *(Color *)(local_28 + (ulong)local_48->second * 4) = local_48->first;
    std::__detail::_Node_const_iterator<std::pair<const_Color,_unsigned_char>,_false,_true>::
    operator++((_Node_const_iterator<std::pair<const_Color,_unsigned_char>,_false,_true> *)this_00);
  }
  local_50 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10cd1e);
  local_50 = local_50 + 0x400;
  local_58 = local_10 + 1;
  local_60._M_current =
       (Color *)std::vector<Color,_std::allocator<Color>_>::begin
                          ((vector<Color,_std::allocator<Color>_> *)in_stack_ffffffffffffff58);
  std::vector<Color,_std::allocator<Color>_>::end
            ((vector<Color,_std::allocator<Color>_> *)in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_>
                             *)this_00,
                            (__normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    __gnu_cxx::__normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_>::
    operator*(&local_60);
    pmVar2 = std::
             unordered_map<Color,_unsigned_char,_std::hash<Color>,_std::equal_to<Color>,_std::allocator<std::pair<const_Color,_unsigned_char>_>_>
             ::at(this_00,in_stack_ffffffffffffff58);
    *local_50 = *pmVar2;
    local_50 = local_50 + 1;
    __gnu_cxx::__normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_>::
    operator++(&local_60);
  }
  if ((local_19 & 1) != 0) {
    std::vector<Color,_std::allocator<Color>_>::begin
              ((vector<Color,_std::allocator<Color>_> *)in_stack_ffffffffffffff58);
    std::vector<Color,_std::allocator<Color>_>::end
              ((vector<Color,_std::allocator<Color>_> *)in_stack_ffffffffffffff58);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_>
                               *)this_00,
                              (__normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_>
                               *)in_stack_ffffffffffffff58), bVar1) {
      pCVar3 = __gnu_cxx::
               __normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_>::
               operator*((__normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_>
                          *)&stack0xffffffffffffff80);
      uStack_89 = (*pCVar3).a;
      *local_50 = uStack_89;
      local_50 = local_50 + 1;
      __gnu_cxx::__normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_>::
      operator++((__normal_iterator<const_Color_*,_std::vector<Color,_std::allocator<Color>_>_> *)
                 &stack0xffffffffffffff80);
    }
  }
  return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x88);
}

Assistant:

std::vector<uint8_t>& writePaletted(const Image& image, const std::unordered_map<Color, uint8_t>& palette, bool separateAlpha) {
		palettedImageScratch.clear();
		palettedImageScratch.resize(1024 + image.size.area() * (separateAlpha ? 2 : 1));
		Color* palData = reinterpret_cast<Color*>(palettedImageScratch.data());
		for (auto& pair : palette) {
			palData[pair.second] = pair.first;
		}
		uint8_t* ptr = palettedImageScratch.data() + 1024;
		for (Color c : image.colorData) {
			if (separateAlpha) {
				c.a = 0;
			}
			*ptr = palette.at(c);
			ptr++;
		}
		if (separateAlpha) {
			for (Color c : image.colorData) {
				*ptr = c.a;
				ptr++;
			}
		}

		return palettedImageScratch;
	}